

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputDCTDecodeStream.cpp
# Opt level: O3

boolean HummusFillInputBuffer(j_decompress_ptr cinfo)

{
  jpeg_source_mgr *pjVar1;
  size_t sVar2;
  
  pjVar1 = cinfo->src;
  sVar2 = (**(code **)(*(long *)pjVar1[1].next_input_byte + 0x10))
                    (pjVar1[1].next_input_byte,pjVar1[1].bytes_in_buffer,0x1000);
  if (sVar2 == 0) {
    *(undefined1 *)pjVar1[1].bytes_in_buffer = 0xff;
    *(undefined1 *)(pjVar1[1].bytes_in_buffer + 1) = 0xd9;
    sVar2 = 2;
  }
  pjVar1->next_input_byte = (JOCTET *)pjVar1[1].bytes_in_buffer;
  pjVar1->bytes_in_buffer = sVar2;
  return 1;
}

Assistant:

HummusFillInputBuffer (j_decompress_ptr cinfo)
{
    HummusSourceManager* src = (HummusSourceManager*) cinfo->src;
    size_t nbytes;
    
    nbytes =  src->mReader->Read((Byte*)(src->buffer),INPUT_BUF_SIZE);
    
    if (nbytes <= 0) {
        /* Insert a fake EOI marker */
        src->buffer[0] = (JOCTET) 0xFF;
        src->buffer[1] = (JOCTET) JPEG_EOI;
        nbytes = 2;
    }
    
    src->pub.next_input_byte = src->buffer;
    src->pub.bytes_in_buffer = nbytes;
    
    return TRUE;
}